

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

realtype N_VMaxNorm_SensWrapper(N_Vector x)

{
  realtype rVar1;
  realtype tmp;
  realtype max;
  int i;
  N_Vector x_local;
  
  tmp = 0.0;
  for (max._4_4_ = 0; max._4_4_ < *(int *)((long)x->content + 8); max._4_4_ = max._4_4_ + 1) {
    rVar1 = N_VMaxNorm(*(N_Vector *)(*x->content + (long)max._4_4_ * 8));
    if (tmp < rVar1) {
      tmp = rVar1;
    }
  }
  return tmp;
}

Assistant:

realtype N_VMaxNorm_SensWrapper(N_Vector x)
{
  int i;
  realtype max, tmp;

  max = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VMaxNorm(NV_VEC_SW(x,i));
    if (tmp > max) max = tmp;
  }

  return(max);
}